

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O0

VertexPacket * __thiscall rr::pa::Triangle::getProvokingVertex(Triangle *this)

{
  int iVar1;
  Triangle *this_local;
  
  iVar1 = this->provokingIndex;
  if (iVar1 == 0) {
    this_local = (Triangle *)this->v0;
  }
  else if (iVar1 == 1) {
    this_local = (Triangle *)this->v1;
  }
  else if (iVar1 == 2) {
    this_local = (Triangle *)this->v2;
  }
  else {
    this_local = (Triangle *)0x0;
  }
  return (VertexPacket *)this_local;
}

Assistant:

VertexPacket* getProvokingVertex (void)
	{
		switch (provokingIndex)
		{
			case 0: return v0;
			case 1: return v1;
			case 2: return v2;
			default:
				DE_ASSERT(false);
				return DE_NULL;
		}
	}